

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::GetOverlapSegment
               (IntPoint pt1a,IntPoint pt1b,IntPoint pt2a,IntPoint pt2b,IntPoint *pt1,IntPoint *pt2)

{
  long64 lVar1;
  long lVar2;
  undefined1 local_40 [8];
  IntPoint pt2a_local;
  IntPoint pt1b_local;
  IntPoint pt1a_local;
  
  pt2a_local.X = pt2a.Y;
  local_40 = (undefined1  [8])pt2a.X;
  pt1b_local.X = pt1b.Y;
  pt2a_local.Y = pt1b.X;
  lVar2 = pt1a.Y;
  pt1b_local.Y = pt1a.X;
  if ((lVar2 != pt1b_local.X) &&
     (lVar1 = Abs((pt1b_local.Y - pt2a_local.Y) / (lVar2 - pt1b_local.X)), lVar1 < 2)) {
    if (lVar2 < pt1b_local.X) {
      SwapPoints((IntPoint *)&pt1b_local.Y,(IntPoint *)&pt2a_local.Y);
    }
    if (pt2a_local.X < pt2b.Y) {
      SwapPoints((IntPoint *)local_40,&pt2b);
    }
    if (lVar2 < pt2a_local.X) {
      pt1->X = pt1b_local.Y;
      pt1->Y = lVar2;
    }
    else {
      pt1->X = (long64)local_40;
      pt1->Y = pt2a_local.X;
    }
    if (pt2b.Y < pt1b_local.X) {
      pt2->X = pt2a_local.Y;
      pt2->Y = pt1b_local.X;
    }
    else {
      pt2->X = pt2b.X;
      pt2->Y = pt2b.Y;
    }
    return pt2->Y < pt1->Y;
  }
  if (pt2a_local.Y < pt1b_local.Y) {
    SwapPoints((IntPoint *)&pt1b_local.Y,(IntPoint *)&pt2a_local.Y);
  }
  if (pt2b.X < (long)local_40) {
    SwapPoints((IntPoint *)local_40,&pt2b);
  }
  if ((long)local_40 < pt1b_local.Y) {
    pt1->X = pt1b_local.Y;
    pt1->Y = lVar2;
  }
  else {
    pt1->X = (long64)local_40;
    pt1->Y = pt2a_local.X;
  }
  if (pt2a_local.Y < pt2b.X) {
    pt2->X = pt2a_local.Y;
    pt2->Y = pt1b_local.X;
  }
  else {
    pt2->X = pt2b.X;
    pt2->Y = pt2b.Y;
  }
  return pt1->X < pt2->X;
}

Assistant:

bool GetOverlapSegment(IntPoint pt1a, IntPoint pt1b, IntPoint pt2a,
  IntPoint pt2b, IntPoint &pt1, IntPoint &pt2)
{
  //precondition: segments are colinear.
  if ( pt1a.Y == pt1b.Y || Abs((pt1a.X - pt1b.X)/(pt1a.Y - pt1b.Y)) > 1 )
  {
    if (pt1a.X > pt1b.X) SwapPoints(pt1a, pt1b);
    if (pt2a.X > pt2b.X) SwapPoints(pt2a, pt2b);
    if (pt1a.X > pt2a.X) pt1 = pt1a; else pt1 = pt2a;
    if (pt1b.X < pt2b.X) pt2 = pt1b; else pt2 = pt2b;
    return pt1.X < pt2.X;
  } else
  {
    if (pt1a.Y < pt1b.Y) SwapPoints(pt1a, pt1b);
    if (pt2a.Y < pt2b.Y) SwapPoints(pt2a, pt2b);
    if (pt1a.Y < pt2a.Y) pt1 = pt1a; else pt1 = pt2a;
    if (pt1b.Y > pt2b.Y) pt2 = pt1b; else pt2 = pt2b;
    return pt1.Y > pt2.Y;
  }
}